

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultReporter.cpp
# Opt level: O2

bool __thiscall
ApprovalTests::DefaultReporter::report(DefaultReporter *this,string *received,string *approved)

{
  undefined1 uVar1;
  long *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  string local_58 [32];
  string local_38 [32];
  
  DefaultReporterFactory::getDefaultReporter();
  ::std::__cxx11::string::string(local_38,(string *)received);
  ::std::__cxx11::string::string(local_58,(string *)approved);
  uVar1 = (**(code **)(*local_68 + 0x10))(local_68,local_38,local_58);
  ::std::__cxx11::string::~string(local_58);
  ::std::__cxx11::string::~string(local_38);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  return (bool)uVar1;
}

Assistant:

bool DefaultReporter::report(std::string received, std::string approved) const
    {
        return DefaultReporterFactory::getDefaultReporter()->report(received, approved);
    }